

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddDefineFlag(void *arg,char *definition)

{
  allocator<char> local_41;
  string local_40;
  void *local_20;
  cmMakefile *mf;
  char *definition_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)definition;
  definition_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,definition,&local_41);
  cmMakefile::AddDefineFlag((cmMakefile *)arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void CCONV cmAddDefineFlag(void* arg, const char* definition)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->AddDefineFlag(definition);
}